

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O1

int blake2b_final(blake2b_state *S,uint8_t *out,uint8_t outlen)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __n;
  long lVar4;
  uint8_t buffer [64];
  uint64_t local_68 [8];
  
  if (0x80 < S->buflen) {
    uVar2 = S->t[0];
    S->t[0] = uVar2 + 0x80;
    S->t[1] = (S->t[1] + 1) - (ulong)(uVar2 < 0xffffffffffffff80);
    blake2b_compress(S,S->buf);
    __n = S->buflen - 0x80;
    S->buflen = __n;
    memcpy(S->buf,S->buf + 0x80,__n);
  }
  uVar3 = S->buflen;
  puVar1 = S->t;
  uVar2 = *puVar1;
  *puVar1 = *puVar1 + uVar3;
  S->t[1] = S->t[1] + (ulong)CARRY8(uVar2,uVar3);
  if (S->last_node != '\0') {
    S->f[1] = 0xffffffffffffffff;
  }
  S->f[0] = 0xffffffffffffffff;
  lVar4 = 0;
  memset(S->buf + uVar3,0,0x100 - uVar3);
  blake2b_compress(S,S->buf);
  do {
    local_68[lVar4] = S->h[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  memcpy(out,local_68,(ulong)outlen);
  return 0;
}

Assistant:

int blake2b_final( blake2b_state *S, uint8_t *out, uint8_t outlen )
{
    int i;
  uint8_t buffer[BLAKE2B_OUTBYTES];

  if( S->buflen > BLAKE2B_BLOCKBYTES )
  {
    blake2b_increment_counter( S, BLAKE2B_BLOCKBYTES );
    blake2b_compress( S, S->buf );
    S->buflen -= BLAKE2B_BLOCKBYTES;
    memcpy( S->buf, S->buf + BLAKE2B_BLOCKBYTES, S->buflen );
  }

  blake2b_increment_counter( S, S->buflen );
  blake2b_set_lastblock( S );
  memset( S->buf + S->buflen, 0, 2 * BLAKE2B_BLOCKBYTES - S->buflen ); /* Padding */
  blake2b_compress( S, S->buf );

  for( i = 0; i < 8; ++i ) /* Output full hash to temp buffer */
    store64( buffer + sizeof( S->h[i] ) * i, S->h[i] );

  memcpy( out, buffer, outlen );
  return 0;
}